

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O3

bool __thiscall nuraft::raft_server::request_leadership(raft_server *this)

{
  int32 iVar1;
  __int_type_conflict _Var2;
  element_type *peVar3;
  __int_type _Var4;
  _func_int **pp_Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar6;
  iterator iVar7;
  undefined4 extraout_var;
  _func_int **pp_Var8;
  undefined4 extraout_var_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  ptr<req_msg> req;
  ptr<log_entry> custom_noti_le;
  unique_lock<std::recursive_mutex> guard;
  log_val_type local_aa;
  undefined1 local_a9;
  string local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_88;
  int local_7c;
  ptr<req_msg> local_78;
  ptr<peer> local_68;
  value_type local_58;
  peer *local_48;
  unique_lock<std::recursive_mutex> local_40;
  
  if ((this->id_ == (this->leader_).super___atomic_base<int>._M_i) ||
     (((this->leader_).super___atomic_base<int>._M_i == this->id_ && ((this->role_)._M_i == leader))
     )) {
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return false;
    }
    iVar6 = (*peVar3->_vptr_logger[7])();
    if (iVar6 < 2) {
      return false;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_a8,"cannot request leadership: this server is already a leader");
    (*peVar3->_vptr_logger[8])
              (peVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"request_leadership",0x4fa,&local_a8);
  }
  else {
    if ((this->leader_).super___atomic_base<int>._M_i != -1) {
      local_40._M_device = &this->lock_;
      local_40._M_owns = false;
      std::unique_lock<std::recursive_mutex>::lock(&local_40);
      local_40._M_owns = true;
      local_a8._M_dataplus._M_p._0_4_ = (this->leader_).super___atomic_base<int>._M_i;
      iVar7 = std::
              _Hashtable<int,_std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(this->peers_)._M_h,(key_type_conflict *)&local_a8);
      if (iVar7.
          super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
          _M_cur == (__node_type *)0x0) {
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3 != (element_type *)0x0) && (iVar6 = (*peVar3->_vptr_logger[7])(), 1 < iVar6)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a8,"cannot request leadership: cannot find peer for leader id %d",
                     (ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
          (*peVar3->_vptr_logger[8])
                    (peVar3,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"request_leadership",0x506,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                          (__int_type_conflict)local_a8._M_dataplus._M_p) != &local_a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                     (__int_type_conflict)local_a8._M_dataplus._M_p));
          }
        }
      }
      else {
        local_48 = *(peer **)((long)iVar7.
                                    super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                                    ._M_cur + 0x10);
        local_88 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)iVar7.
                           super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>
                           ._M_cur + 0x18);
        if (local_88 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_88->_M_use_count = local_88->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_88->_M_use_count = local_88->_M_use_count + 1;
          }
        }
        _Var4 = (((this->state_).super___shared_ptr<nuraft::srv_state,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->term_).super___atomic_base<unsigned_long>._M_i;
        iVar6 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        pp_Var8 = (_func_int **)term_for_log(this,CONCAT44(extraout_var,iVar6) - 1);
        iVar6 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        pp_Var5 = (_func_int **)(this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
        (local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_use_count = 1;
        (local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_M_weak_count = 1;
        (local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
        ->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005be268;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)
             (local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi + 1);
        iVar1 = this->id_;
        _Var2 = (this->leader_).super___atomic_base<int>._M_i;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_use_count = (int)_Var4;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._M_weak_count = (int)(_Var4 >> 0x20);
        *(undefined4 *)
         &local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          [2]._vptr__Sp_counted_base = 0x1c;
        *(int32 *)((long)&local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi[2]._vptr__Sp_counted_base + 4) = iVar1;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [2]._M_use_count = _Var2;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [1]._vptr__Sp_counted_base = (_func_int **)&PTR__req_msg_005be2b8;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [3]._vptr__Sp_counted_base = pp_Var8;
        *(long *)&local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi[3]._M_use_count = CONCAT44(extraout_var_00,iVar6) + -1;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [4]._vptr__Sp_counted_base = pp_Var5;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [4]._M_use_count = 0;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [4]._M_weak_count = 0;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [5]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [5]._M_use_count = 0;
        local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        [5]._M_weak_count = 0;
        this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
        this_01->_M_use_count = 1;
        this_01->_M_weak_count = 1;
        this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_005be350;
        *(undefined4 *)&this_01[1]._vptr__Sp_counted_base = 3;
        this_01[1]._M_use_count = 0;
        this_01[1]._M_weak_count = 0;
        this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
        local_7c = 0;
        custom_notification_msg::serialize((custom_notification_msg *)&local_a8);
        this_00 = local_88;
        local_aa = custom;
        local_58.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::log_entry,std::allocator<nuraft::log_entry>,int,std::shared_ptr<nuraft::buffer>,nuraft::log_val_type>
                  (&local_58.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(log_entry **)&local_58,(allocator<nuraft::log_entry> *)&local_a9,
                   &local_7c,(shared_ptr<nuraft::buffer> *)&local_a8,&local_aa);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._M_string_length);
        }
        std::
        vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
        ::push_back(&(local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr)->log_entries_,&local_58);
        local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
        local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             this_00;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        peer::send_req(local_48,&local_68,&local_78,&this->resp_handler_);
        if (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_68.super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar3 != (element_type *)0x0) && (iVar6 = (*peVar3->_vptr_logger[7])(), 3 < iVar6)) {
          peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    (&local_a8,"sent leadership request to leader %d",
                     (ulong)(uint)(this->leader_).super___atomic_base<int>._M_i);
          (*peVar3->_vptr_logger[8])
                    (peVar3,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
                     ,"request_leadership",0x51f,&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                          (__int_type_conflict)local_a8._M_dataplus._M_p) != &local_a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                     (__int_type_conflict)local_a8._M_dataplus._M_p));
          }
        }
        if (local_58.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_58.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        if (local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_78.super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
      }
      std::unique_lock<std::recursive_mutex>::~unique_lock(&local_40);
      return iVar7.
             super__Node_iterator_base<std::pair<const_int,_std::shared_ptr<nuraft::peer>_>,_false>.
             _M_cur != (__node_type *)0x0;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (peVar3 == (element_type *)0x0) {
      return false;
    }
    iVar6 = (*peVar3->_vptr_logger[7])();
    if (iVar6 < 2) {
      return false;
    }
    peVar3 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    msg_if_given_abi_cxx11_(&local_a8,"cannot request leadership: cannot find leader");
    (*peVar3->_vptr_logger[8])
              (peVar3,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/raft_server.cxx"
               ,"request_leadership",0x4fe,&local_a8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(__int_type_conflict)local_a8._M_dataplus._M_p) !=
      &local_a8.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                             (__int_type_conflict)local_a8._M_dataplus._M_p));
  }
  return false;
}

Assistant:

bool raft_server::request_leadership() {
    // If this server is already a leader, do nothing.
    if (id_ == leader_ || is_leader()) {
        p_er("cannot request leadership: this server is already a leader");
        return false;
    }
    if (leader_ == -1) {
        p_er("cannot request leadership: cannot find leader");
        return false;
    }

    recur_lock(lock_);
    auto entry = peers_.find(leader_);
    if (entry == peers_.end()) {
        p_er("cannot request leadership: cannot find peer for "
             "leader id %d", leader_.load());
        return false;
    }
    ptr<peer> pp = entry->second;

    // Send resignation message to the follower.
    ptr<req_msg> req = cs_new<req_msg>
                       ( state_->get_term(),
                         msg_type::custom_notification_request,
                         id_, leader_,
                         term_for_log(log_store_->next_slot() - 1),
                         log_store_->next_slot() - 1,
                         quick_commit_index_.load() );

    // Create a notification.
    ptr<custom_notification_msg> custom_noti =
        cs_new<custom_notification_msg>
        ( custom_notification_msg::request_resignation );

    // Wrap it using log_entry.
    ptr<log_entry> custom_noti_le =
        cs_new<log_entry>(0, custom_noti->serialize(), log_val_type::custom);

    req->log_entries().push_back(custom_noti_le);
    pp->send_req(pp, req, resp_handler_);
    p_in("sent leadership request to leader %d", leader_.load());
    return true;
}